

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseStringToStream<0u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,StackStream<char> *os)

{
  byte bVar1;
  Ch c;
  byte *pbVar2;
  Ch *pCVar3;
  char *pcVar4;
  bool bVar5;
  uint codepoint;
  uint uVar6;
  size_t escapeOffset;
  
  do {
    while( true ) {
      pbVar2 = (byte *)is->src_;
      bVar1 = *pbVar2;
      if (bVar1 != 0x5c) break;
      escapeOffset = (long)pbVar2 - (long)is->head_;
      is->src_ = (Ch *)(pbVar2 + 1);
      c = ""[pbVar2[1]];
      if (c == '\0') {
        if (pbVar2[1] != 0x75) {
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/reader.h"
                          ,0x40f,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                         );
          }
          *(undefined4 *)(this + 0x30) = 10;
          goto LAB_0011a1fc;
        }
        is->src_ = (Ch *)(pbVar2 + 2);
        codepoint = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                              (this,is,escapeOffset);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        if ((codepoint & 0xfffffc00) == 0xd800) {
          pcVar4 = is->src_;
          if ((*pcVar4 == '\\') && (is->src_ = pcVar4 + 1, pcVar4[1] == 'u')) {
            is->src_ = pcVar4 + 2;
            uVar6 = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                              (this,is,escapeOffset);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            if (0xfffffbff < uVar6 - 0xe000) {
              codepoint = codepoint * 0x400 + uVar6 + 0xfca02400;
              goto LAB_0011a0c5;
            }
          }
          *(undefined4 *)(this + 0x30) = 9;
LAB_0011a1fc:
          *(size_t *)(this + 0x38) = escapeOffset;
          return;
        }
LAB_0011a0c5:
        UTF8<char>::
        Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                  (os,codepoint);
      }
      else {
        is->src_ = (Ch *)(pbVar2 + 2);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        StackStream<char>::Put(os,c);
      }
    }
    if (bVar1 == 0x22) {
      is->src_ = (Ch *)(pbVar2 + 1);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      StackStream<char>::Put(os,'\0');
      return;
    }
    if (bVar1 < 0x20) {
      if (bVar1 != 0) {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/reader.h"
                        ,0x41a,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                       );
        }
        pCVar3 = is->head_;
        goto LAB_0011a167;
      }
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/reader.h"
                      ,0x418,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                     );
      }
      pCVar3 = is->head_;
      *(undefined4 *)(this + 0x30) = 0xb;
      goto LAB_0011a16e;
    }
    pCVar3 = is->head_;
    bVar5 = Transcoder<rapidjson::UTF8<char>,rapidjson::UTF8<char>>::
            Transcode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                      (is,os);
    if (!bVar5) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/reader.h"
                      ,0x421,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                     );
      }
LAB_0011a167:
      *(undefined4 *)(this + 0x30) = 0xc;
LAB_0011a16e:
      *(long *)(this + 0x38) = (long)pbVar2 - (long)pCVar3;
      return;
    }
  } while( true );
}

Assistant:

RAPIDJSON_FORCEINLINE void ParseStringToStream(InputStream& is, OutputStream& os) {
//!@cond RAPIDJSON_HIDDEN_FROM_DOXYGEN
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
        static const char escape[256] = {
            Z16, Z16, 0, 0,'\"', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, '/',
            Z16, Z16, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,'\\', 0, 0, 0,
            0, 0,'\b', 0, 0, 0,'\f', 0, 0, 0, 0, 0, 0, 0,'\n', 0,
            0, 0,'\r', 0,'\t', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16
        };
#undef Z16
//!@endcond

        for (;;) {
            // Scan and copy string before "\\\"" or < 0x20. This is an optional optimzation.
            if (!(parseFlags & kParseValidateEncodingFlag))
                ScanCopyUnescapedString(is, os);

            Ch c = is.Peek();
            if (RAPIDJSON_UNLIKELY(c == '\\')) {    // Escape
                size_t escapeOffset = is.Tell();    // For invalid escaping, report the initial '\\' as error offset
                is.Take();
                Ch e = is.Peek();
                if ((sizeof(Ch) == 1 || unsigned(e) < 256) && RAPIDJSON_LIKELY(escape[static_cast<unsigned char>(e)])) {
                    is.Take();
                    os.Put(static_cast<typename TEncoding::Ch>(escape[static_cast<unsigned char>(e)]));
                }
                else if ((parseFlags & kParseEscapedApostropheFlag) && RAPIDJSON_LIKELY(e == '\'')) { // Allow escaped apostrophe
                    is.Take();
                    os.Put('\'');
                }
                else if (RAPIDJSON_LIKELY(e == 'u')) {    // Unicode
                    is.Take();
                    unsigned codepoint = ParseHex4(is, escapeOffset);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    if (RAPIDJSON_UNLIKELY(codepoint >= 0xD800 && codepoint <= 0xDBFF)) {
                        // Handle UTF-16 surrogate pair
                        if (RAPIDJSON_UNLIKELY(!Consume(is, '\\') || !Consume(is, 'u')))
                            RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        unsigned codepoint2 = ParseHex4(is, escapeOffset);
                        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                        if (RAPIDJSON_UNLIKELY(codepoint2 < 0xDC00 || codepoint2 > 0xDFFF))
                            RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        codepoint = (((codepoint - 0xD800) << 10) | (codepoint2 - 0xDC00)) + 0x10000;
                    }
                    TEncoding::Encode(os, codepoint);
                }
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringEscapeInvalid, escapeOffset);
            }
            else if (RAPIDJSON_UNLIKELY(c == '"')) {    // Closing double quote
                is.Take();
                os.Put('\0');   // null-terminate the string
                return;
            }
            else if (RAPIDJSON_UNLIKELY(static_cast<unsigned>(c) < 0x20)) { // RFC 4627: unescaped = %x20-21 / %x23-5B / %x5D-10FFFF
                if (c == '\0')
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringMissQuotationMark, is.Tell());
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, is.Tell());
            }
            else {
                size_t offset = is.Tell();
                if (RAPIDJSON_UNLIKELY((parseFlags & kParseValidateEncodingFlag ?
                    !Transcoder<SEncoding, TEncoding>::Validate(is, os) :
                    !Transcoder<SEncoding, TEncoding>::Transcode(is, os))))
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, offset);
            }
        }
    }